

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

bool CSOAA::test_ldf_sequence(ldf *data,multi_ex *ec_seq)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  pointer ppeVar4;
  example **ec;
  pointer ppeVar5;
  
  ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar4 == ppeVar5) {
    bVar1 = 1;
  }
  else {
    bVar1 = (*(code *)PTR_test_label_002b1ae0)(&(*ppeVar5)->l);
    ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  for (; ppeVar5 != ppeVar4; ppeVar5 = ppeVar5 + 1) {
    bVar2 = (*(code *)PTR_test_label_002b1ae0)(&(*ppeVar5)->l);
    if (bVar2 != (bVar1 & 1)) {
      poVar3 = std::operator<<(&(data->all->trace_message).super_ostream,
                               "warning: ldf example has mix of train/test data; assuming test");
      std::endl<char,std::char_traits<char>>(poVar3);
      bVar1 = 1;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_ldf_sequence(ldf& data, multi_ex& ec_seq)
{
  bool isTest;
  if (0 == ec_seq.size())
    isTest = true;
  else
    isTest = COST_SENSITIVE::cs_label.test_label(&ec_seq[0]->l);
  for (const auto & ec : ec_seq)
  {
    // Each sub-example must have just one cost
    assert(ec->l.cs.costs.size() == 1);

    if (COST_SENSITIVE::cs_label.test_label(&ec->l) != isTest)
    {
      isTest = true;
      data.all->trace_message << "warning: ldf example has mix of train/test data; assuming test" << endl;
    }
  }
  return isTest;
}